

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaBlockVector::Allocate
          (VmaBlockVector *this,VkDeviceSize size,VkDeviceSize alignment,
          VmaAllocationCreateInfo *createInfo,VmaSuballocationType suballocType,
          size_t allocationCount,VmaAllocation *pAllocations)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long in_RSI;
  VmaBlockVector *in_RDI;
  ulong in_R9;
  void *in_stack_00000008;
  VmaMutexLockWrite lock;
  VkResult res;
  size_t allocIndex;
  VmaAllocation in_stack_00000068;
  VmaAllocation *in_stack_000000d0;
  VmaSuballocationType in_stack_000000dc;
  VmaAllocationCreateInfo *in_stack_000000e0;
  VkDeviceSize in_stack_000000e8;
  VkDeviceSize in_stack_000000f0;
  VmaBlockVector *in_stack_000000f8;
  VmaRWMutex *in_stack_ffffffffffffffa8;
  VmaMutexLockWrite *in_stack_ffffffffffffffb0;
  VkResult local_3c;
  ulong local_38;
  unsigned_long local_18;
  unsigned_long local_10;
  
  local_3c = VK_SUCCESS;
  local_10 = in_RSI;
  puVar2 = std::max<unsigned_long>(&local_18,&in_RDI->m_MinAllocationAlignment);
  local_18 = *puVar2;
  bVar1 = IsCorruptionDetectionEnabled(in_RDI);
  if (bVar1) {
    local_10 = VmaAlignUp<unsigned_long>(local_10,4);
    local_18 = VmaAlignUp<unsigned_long>(local_18,4);
  }
  VmaMutexLockWrite::VmaMutexLockWrite
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,SUB81((ulong)in_RDI >> 0x38,0));
  local_38 = 0;
  while ((local_38 < in_R9 &&
         (local_3c = AllocatePage(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                                  in_stack_000000e0,in_stack_000000dc,in_stack_000000d0),
         local_3c == VK_SUCCESS))) {
    local_38 = local_38 + 1;
  }
  VmaMutexLockWrite::~VmaMutexLockWrite((VmaMutexLockWrite *)in_RDI);
  if (local_3c != VK_SUCCESS) {
    while (local_38 != 0) {
      Free((VmaBlockVector *)pAllocations,in_stack_00000068);
      local_38 = local_38 - 1;
    }
    memset(in_stack_00000008,0,in_R9 << 3);
  }
  return local_3c;
}

Assistant:

VkResult VmaBlockVector::Allocate(
    VkDeviceSize size,
    VkDeviceSize alignment,
    const VmaAllocationCreateInfo& createInfo,
    VmaSuballocationType suballocType,
    size_t allocationCount,
    VmaAllocation* pAllocations)
{
    size_t allocIndex;
    VkResult res = VK_SUCCESS;

    alignment = VMA_MAX(alignment, m_MinAllocationAlignment);

    if (IsCorruptionDetectionEnabled())
    {
        size = VmaAlignUp<VkDeviceSize>(size, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
        alignment = VmaAlignUp<VkDeviceSize>(alignment, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
    }

    {
        VmaMutexLockWrite lock(m_Mutex, m_hAllocator->m_UseMutex);
        for (allocIndex = 0; allocIndex < allocationCount; ++allocIndex)
        {
            res = AllocatePage(
                size,
                alignment,
                createInfo,
                suballocType,
                pAllocations + allocIndex);
            if (res != VK_SUCCESS)
            {
                break;
            }
        }
    }

    if (res != VK_SUCCESS)
    {
        // Free all already created allocations.
        while (allocIndex--)
            Free(pAllocations[allocIndex]);
        memset(pAllocations, 0, sizeof(VmaAllocation) * allocationCount);
    }

    return res;
}